

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Maybe<unsigned_long> __thiscall
kj::
Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>,_kj::HashIndex<kj::_::(anonymous_namespace)::StringLengthCompare>_>
::Impl<1UL,_false>::insert
          (Impl<1UL,_false> *this,
          Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
          size_t pos,StringPtr *row,uint skip)

{
  StringPtr **ppSVar1;
  int iVar2;
  StringPtr *pSVar3;
  size_t sVar4;
  ArrayDisposer *pAVar5;
  uint uVar6;
  Impl<1UL,_false> *in_RAX;
  long lVar7;
  Impl<1UL,_false> *extraout_RAX;
  _ *p_Var8;
  uint uVar9;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  _ *this_00;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *size;
  _ *p_Var10;
  undefined4 in_register_00000084;
  RemoveConst<kj::StringPtr> *pRVar11;
  undefined8 uVar12;
  Maybe<unsigned_long> MVar13;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  bool local_89;
  Impl<1UL,_false> *local_88;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *local_80;
  size_t local_78;
  StringPtr *local_70;
  size_t local_68;
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
  local_60;
  
  if (skip != 1) {
    pSVar3 = (table->rows).builder.ptr;
    lVar7 = (long)(table->rows).builder.pos - (long)pSVar3 >> 4;
    sVar4 = (row->content).size_;
    uVar12 = table[1].rows.builder.disposer;
    pRVar11 = table[1].rows.builder.pos;
    this_00 = (_ *)table[1].rows.builder.endPtr;
    size = table;
    local_88 = this;
    local_78 = pos;
    local_70 = row;
    local_68 = pos;
    if ((ulong)(uVar12 * 2) < ((long)&(pRVar11->content).ptr + lVar7) * 3 + 3U) {
      ppSVar1 = &table[1].rows.builder.endPtr;
      oldBuckets.size_ = lVar7 * 3 + 3;
      oldBuckets.ptr = (HashBucket *)uVar12;
      _::rehash((Array<kj::_::HashBucket> *)&local_60,this_00,oldBuckets,
                CONCAT44(in_register_00000084,skip));
      size = (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             *ppSVar1;
      if (size != (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                   *)0x0) {
        pAVar5 = table[1].rows.builder.disposer;
        *ppSVar1 = (StringPtr *)0x0;
        table[1].rows.builder.disposer = (ArrayDisposer *)0x0;
        (**(code **)**(undefined8 **)&table[1].indexes)
                  (*(undefined8 **)&table[1].indexes,size,8,pAVar5,pAVar5,0);
      }
      this_00 = (_ *)CONCAT71(local_60.maybeFunc.ptr._1_7_,local_60.maybeFunc.ptr.isSet);
      table[1].rows.builder.endPtr = (StringPtr *)this_00;
      table[1].rows.builder.disposer = (ArrayDisposer *)local_60.maybeFunc.ptr.field_1.value.success
      ;
      *(HashIndex<kj::_::(anonymous_namespace)::StringHasher> **)&table[1].indexes =
           local_60.maybeFunc.ptr.field_1.value.indexObj;
      table[1].rows.builder.pos = (RemoveConst<kj::StringPtr> *)0x0;
      pRVar11 = (RemoveConst<kj::StringPtr> *)0x0;
      uVar12 = local_60.maybeFunc.ptr.field_1.value.success;
    }
    local_80 = table + 1;
    uVar6 = _::anon_unknown_0::StringLengthCompare::hashCode
                      ((StringLengthCompare *)(sVar4 - 1),(size_t)size);
    uVar9 = (int)uVar12 - 1U & uVar6;
    p_Var8 = (_ *)0x0;
LAB_0016841d:
    pos._4_4_ = 0;
    pos._0_4_ = uVar9;
    p_Var10 = this_00 + pos * 8;
    iVar2 = *(int *)(p_Var10 + 4);
    if (iVar2 == 1) {
      if (p_Var8 == (_ *)0x0) {
        p_Var8 = p_Var10;
      }
    }
    else {
      if (iVar2 == 0) {
        if (p_Var8 != (_ *)0x0) {
          table[1].rows.builder.pos =
               (RemoveConst<kj::StringPtr> *)((long)&pRVar11[-1].content.size_ + 7);
          p_Var10 = p_Var8;
        }
        *(ulong *)p_Var10 = ((ulong)uVar6 | local_78 << 0x20) + 0x200000000;
        local_60.maybeFunc.ptr.isSet = true;
        local_60.maybeFunc.ptr.field_1.value.success = &local_89;
        local_60.maybeFunc.ptr.field_1.value.indexObj =
             (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)local_80;
        local_60.maybeFunc.ptr.field_1.value.pos = &local_68;
        local_60.maybeFunc.ptr.field_1.value.row = local_70;
        *local_88 = (Impl<1UL,_false>)0x0;
        local_89 = true;
        local_60.maybeFunc.ptr.field_1.value.table = table;
        _::
        Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
        ::~Deferred(&local_60);
        in_RAX = extraout_RAX;
        pos = (size_t)extraout_RDX;
        goto LAB_001684e1;
      }
      if ((*(uint *)p_Var10 == uVar6) && (pSVar3[iVar2 - 2].content.size_ == sVar4))
      goto LAB_001684d5;
    }
    uVar9 = (uint)(HashBucket *)(pos + 1);
    if ((HashBucket *)(pos + 1) == (HashBucket *)uVar12) {
      uVar9 = 0;
    }
    goto LAB_0016841d;
  }
  *this = (Impl<1UL,_false>)0x0;
LAB_001684e1:
  MVar13.ptr.field_1.value = pos;
  MVar13.ptr._0_8_ = in_RAX;
  return (Maybe<unsigned_long>)MVar13.ptr;
LAB_001684d5:
  *local_88 = (Impl<1UL,_false>)0x1;
  *(ulong *)(local_88 + 8) = (ulong)(iVar2 - 2);
  in_RAX = local_88;
  goto LAB_001684e1;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }